

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_argerror(lua_State *L,int arg,char *extramsg)

{
  int iVar1;
  char *local_c8;
  char *local_c0;
  char *argword;
  lua_Debug ar;
  char *extramsg_local;
  int arg_local;
  lua_State *L_local;
  
  ar.i_ci = (CallInfo *)extramsg;
  iVar1 = lua_getstack(L,0,(lua_Debug *)&argword);
  if (iVar1 == 0) {
    L_local._4_4_ = luaL_error(L,"bad argument #%d (%s)",(ulong)(uint)arg,ar.i_ci);
  }
  else {
    lua_getinfo(L,"nt",(lua_Debug *)&argword);
    if ((int)(uint)ar.linedefined._3_1_ < arg) {
      extramsg_local._4_4_ = arg - (uint)ar.linedefined._3_1_;
      iVar1 = strcmp(ar.name,"method");
      if ((iVar1 == 0) &&
         (extramsg_local._4_4_ = extramsg_local._4_4_ - 1, extramsg_local._4_4_ == 0)) {
        iVar1 = luaL_error(L,"calling \'%s\' on bad self (%s)",ar._0_8_,ar.i_ci);
        return iVar1;
      }
      local_c0 = "argument";
    }
    else {
      local_c0 = "extra argument";
      extramsg_local._4_4_ = arg;
    }
    if (ar._0_8_ == 0) {
      iVar1 = pushglobalfuncname(L,(lua_Debug *)&argword);
      if (iVar1 == 0) {
        local_c8 = "?";
      }
      else {
        local_c8 = lua_tolstring(L,-1,(size_t *)0x0);
      }
      ar._0_8_ = local_c8;
    }
    L_local._4_4_ =
         luaL_error(L,"bad %s #%d to \'%s\' (%s)",local_c0,(ulong)extramsg_local._4_4_,ar._0_8_,
                    ar.i_ci);
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_argerror (lua_State *L, int arg, const char *extramsg) {
  lua_Debug ar;
  const char *argword;
  if (!lua_getstack(L, 0, &ar))  /* no stack frame? */
    return luaL_error(L, "bad argument #%d (%s)", arg, extramsg);
  lua_getinfo(L, "nt", &ar);
  if (arg <= ar.extraargs)  /* error in an extra argument? */
    argword =  "extra argument";
  else {
    arg -= ar.extraargs;  /* do not count extra arguments */
    if (strcmp(ar.namewhat, "method") == 0) {  /* colon syntax? */
      arg--;  /* do not count (extra) self argument */
      if (arg == 0)  /* error in self argument? */
        return luaL_error(L, "calling '%s' on bad self (%s)",
                               ar.name, extramsg);
      /* else go through; error in a regular argument */
    }
    argword = "argument";
  }
  if (ar.name == NULL)
    ar.name = (pushglobalfuncname(L, &ar)) ? lua_tostring(L, -1) : "?";
  return luaL_error(L, "bad %s #%d to '%s' (%s)",
                       argword, arg, ar.name, extramsg);
}